

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::NConnectShapeF
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int connect,int order)

{
  long in_RDI;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_4 = TPZShapeHDiv<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                        (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_4 = TPZShapeHDivConstant<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                        (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::NConnectShapeF(int connect, int order)const
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        return TPZShapeHDiv<TSHAPE>::ComputeNConnectShapeF(connect,order);    
        break;
    case HDivFamily::EHDivConstant:
        return TPZShapeHDivConstant<TSHAPE>::ComputeNConnectShapeF(connect,order);
        break;
    
    default:
        return -1;
        break;
    }
    return -1;
 }